

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 (*pauVar44) [16];
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar60 [32];
  undefined1 auVar59 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar82;
  float fVar87;
  undefined1 auVar83 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  float fVar95;
  undefined1 auVar96 [32];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [64];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  float fVar107;
  float fVar110;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar111;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar118;
  undefined4 uVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [32];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar128 [32];
  float fVar134;
  float fVar136;
  undefined1 auVar135 [32];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_29c0 [16];
  undefined1 (*local_29b0) [16];
  long local_29a8;
  long local_29a0;
  ulong local_2998;
  RTCFilterFunctionNArguments local_2990;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  RTCHitN local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined4 local_2850;
  undefined4 uStack_284c;
  undefined4 uStack_2848;
  undefined4 uStack_2844;
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [8];
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined4 uStack_2624;
  undefined1 local_2620 [32];
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  pauVar52 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar119 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2500._4_4_ = uVar119;
  local_2500._0_4_ = uVar119;
  local_2500._8_4_ = uVar119;
  local_2500._12_4_ = uVar119;
  local_2500._16_4_ = uVar119;
  local_2500._20_4_ = uVar119;
  local_2500._24_4_ = uVar119;
  local_2500._28_4_ = uVar119;
  auVar94 = ZEXT3264(local_2500);
  uVar119 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2520._4_4_ = uVar119;
  local_2520._0_4_ = uVar119;
  local_2520._8_4_ = uVar119;
  local_2520._12_4_ = uVar119;
  local_2520._16_4_ = uVar119;
  local_2520._20_4_ = uVar119;
  local_2520._24_4_ = uVar119;
  local_2520._28_4_ = uVar119;
  auVar97 = ZEXT3264(local_2520);
  uVar119 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2540._4_4_ = uVar119;
  local_2540._0_4_ = uVar119;
  local_2540._8_4_ = uVar119;
  local_2540._12_4_ = uVar119;
  local_2540._16_4_ = uVar119;
  local_2540._20_4_ = uVar119;
  local_2540._24_4_ = uVar119;
  local_2540._28_4_ = uVar119;
  auVar106 = ZEXT3264(local_2540);
  fVar127 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar134 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar137 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar107 = fVar127 * 0.99999964;
  fVar111 = fVar134 * 0.99999964;
  fVar118 = fVar137 * 0.99999964;
  fVar127 = fVar127 * 1.0000004;
  fVar134 = fVar134 * 1.0000004;
  fVar137 = fVar137 * 1.0000004;
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2998 = uVar50 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_28e0._4_4_ = iVar1;
  local_28e0._0_4_ = iVar1;
  local_28e0._8_4_ = iVar1;
  local_28e0._12_4_ = iVar1;
  local_28e0._16_4_ = iVar1;
  local_28e0._20_4_ = iVar1;
  local_28e0._24_4_ = iVar1;
  local_28e0._28_4_ = iVar1;
  auVar93 = ZEXT3264(local_28e0);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar57 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2620._16_16_ = mm_lookupmask_ps._240_16_;
  local_2620._0_16_ = mm_lookupmask_ps._0_16_;
  local_29b0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar72._16_4_ = 0x3f800000;
  auVar72._20_4_ = 0x3f800000;
  auVar72._24_4_ = 0x3f800000;
  auVar72._28_4_ = 0x3f800000;
  auVar60._8_4_ = 0xbf800000;
  auVar60._0_8_ = 0xbf800000bf800000;
  auVar60._12_4_ = 0xbf800000;
  auVar60._16_4_ = 0xbf800000;
  auVar60._20_4_ = 0xbf800000;
  auVar60._24_4_ = 0xbf800000;
  auVar60._28_4_ = 0xbf800000;
  _local_2640 = vblendvps_avx(auVar72,auVar60,local_2620);
  local_2560 = fVar107;
  fStack_255c = fVar107;
  fStack_2558 = fVar107;
  fStack_2554 = fVar107;
  fStack_2550 = fVar107;
  fStack_254c = fVar107;
  fStack_2548 = fVar107;
  fStack_2544 = fVar107;
  local_2580 = fVar111;
  fStack_257c = fVar111;
  fStack_2578 = fVar111;
  fStack_2574 = fVar111;
  fStack_2570 = fVar111;
  fStack_256c = fVar111;
  fStack_2568 = fVar111;
  fStack_2564 = fVar111;
  local_25a0 = fVar118;
  fStack_259c = fVar118;
  fStack_2598 = fVar118;
  fStack_2594 = fVar118;
  fStack_2590 = fVar118;
  fStack_258c = fVar118;
  fStack_2588 = fVar118;
  fStack_2584 = fVar118;
  local_25c0 = fVar127;
  fStack_25bc = fVar127;
  fStack_25b8 = fVar127;
  fStack_25b4 = fVar127;
  fStack_25b0 = fVar127;
  fStack_25ac = fVar127;
  fStack_25a8 = fVar127;
  fStack_25a4 = fVar127;
  local_25e0 = fVar134;
  fStack_25dc = fVar134;
  fStack_25d8 = fVar134;
  fStack_25d4 = fVar134;
  fStack_25d0 = fVar134;
  fStack_25cc = fVar134;
  fStack_25c8 = fVar134;
  fStack_25c4 = fVar134;
  local_2600 = fVar137;
  fStack_25fc = fVar137;
  fStack_25f8 = fVar137;
  fStack_25f4 = fVar137;
  fStack_25f0 = fVar137;
  fStack_25ec = fVar137;
  fStack_25e8 = fVar137;
  fStack_25e4 = fVar137;
  fVar110 = fVar107;
  fVar82 = fVar107;
  fVar95 = fVar107;
  fVar87 = fVar107;
  fVar88 = fVar107;
  fVar89 = fVar107;
  fVar90 = fVar111;
  fVar91 = fVar111;
  fVar114 = fVar111;
  fVar115 = fVar111;
  fVar116 = fVar111;
  fVar117 = fVar111;
  fVar121 = fVar118;
  fVar122 = fVar118;
  fVar123 = fVar118;
  fVar124 = fVar118;
  fVar125 = fVar118;
  fVar126 = fVar118;
  fVar129 = fVar127;
  fVar130 = fVar127;
  fVar131 = fVar127;
  fVar132 = fVar127;
  fVar133 = fVar127;
  fVar98 = fVar127;
  fVar99 = fVar134;
  fVar100 = fVar134;
  fVar101 = fVar134;
  fVar102 = fVar134;
  fVar103 = fVar134;
  fVar136 = fVar134;
  fVar139 = fVar137;
  fVar140 = fVar137;
  fVar141 = fVar137;
  fVar142 = fVar137;
  fVar143 = fVar137;
  fVar144 = fVar137;
LAB_0167bc9e:
  do {
    do {
      if (pauVar52 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar44 = pauVar52 + -1;
      pauVar52 = pauVar52 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar44 + 8));
    uVar45 = *(ulong *)*pauVar52;
    while ((uVar45 & 8) == 0) {
      auVar60 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar50),auVar94._0_32_);
      auVar65._4_4_ = fVar110 * auVar60._4_4_;
      auVar65._0_4_ = fVar107 * auVar60._0_4_;
      auVar65._8_4_ = fVar82 * auVar60._8_4_;
      auVar65._12_4_ = fVar95 * auVar60._12_4_;
      auVar65._16_4_ = fVar87 * auVar60._16_4_;
      auVar65._20_4_ = fVar88 * auVar60._20_4_;
      auVar65._24_4_ = fVar89 * auVar60._24_4_;
      auVar65._28_4_ = auVar60._28_4_;
      auVar60 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar49),auVar97._0_32_);
      auVar20._4_4_ = fVar90 * auVar60._4_4_;
      auVar20._0_4_ = fVar111 * auVar60._0_4_;
      auVar20._8_4_ = fVar91 * auVar60._8_4_;
      auVar20._12_4_ = fVar114 * auVar60._12_4_;
      auVar20._16_4_ = fVar115 * auVar60._16_4_;
      auVar20._20_4_ = fVar116 * auVar60._20_4_;
      auVar20._24_4_ = fVar117 * auVar60._24_4_;
      auVar20._28_4_ = auVar60._28_4_;
      auVar60 = vmaxps_avx(auVar65,auVar20);
      auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar51),auVar106._0_32_);
      auVar12._4_4_ = fVar121 * auVar72._4_4_;
      auVar12._0_4_ = fVar118 * auVar72._0_4_;
      auVar12._8_4_ = fVar122 * auVar72._8_4_;
      auVar12._12_4_ = fVar123 * auVar72._12_4_;
      auVar12._16_4_ = fVar124 * auVar72._16_4_;
      auVar12._20_4_ = fVar125 * auVar72._20_4_;
      auVar12._24_4_ = fVar126 * auVar72._24_4_;
      auVar12._28_4_ = auVar72._28_4_;
      auVar72 = vmaxps_avx(auVar12,auVar93._0_32_);
      local_2800 = vmaxps_avx(auVar60,auVar72);
      auVar60 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + local_2998),auVar94._0_32_);
      auVar13._4_4_ = fVar129 * auVar60._4_4_;
      auVar13._0_4_ = fVar127 * auVar60._0_4_;
      auVar13._8_4_ = fVar130 * auVar60._8_4_;
      auVar13._12_4_ = fVar131 * auVar60._12_4_;
      auVar13._16_4_ = fVar132 * auVar60._16_4_;
      auVar13._20_4_ = fVar133 * auVar60._20_4_;
      auVar13._24_4_ = fVar98 * auVar60._24_4_;
      auVar13._28_4_ = auVar60._28_4_;
      auVar60 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + (uVar49 ^ 0x20)),auVar97._0_32_);
      auVar14._4_4_ = fVar99 * auVar60._4_4_;
      auVar14._0_4_ = fVar134 * auVar60._0_4_;
      auVar14._8_4_ = fVar100 * auVar60._8_4_;
      auVar14._12_4_ = fVar101 * auVar60._12_4_;
      auVar14._16_4_ = fVar102 * auVar60._16_4_;
      auVar14._20_4_ = fVar103 * auVar60._20_4_;
      auVar14._24_4_ = fVar136 * auVar60._24_4_;
      auVar14._28_4_ = auVar60._28_4_;
      auVar60 = vminps_avx(auVar13,auVar14);
      auVar72 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + (uVar51 ^ 0x20)),auVar106._0_32_);
      auVar15._4_4_ = fVar139 * auVar72._4_4_;
      auVar15._0_4_ = fVar137 * auVar72._0_4_;
      auVar15._8_4_ = fVar140 * auVar72._8_4_;
      auVar15._12_4_ = fVar141 * auVar72._12_4_;
      auVar15._16_4_ = fVar142 * auVar72._16_4_;
      auVar15._20_4_ = fVar143 * auVar72._20_4_;
      auVar15._24_4_ = fVar144 * auVar72._24_4_;
      auVar15._28_4_ = auVar72._28_4_;
      auVar72 = vminps_avx(auVar15,auVar57._0_32_);
      auVar60 = vminps_avx(auVar60,auVar72);
      auVar60 = vcmpps_avx(local_2800,auVar60,2);
      uVar40 = vmovmskps_avx(auVar60);
      if (uVar40 == 0) goto LAB_0167bc9e;
      uVar40 = uVar40 & 0xff;
      uVar47 = uVar45 & 0xfffffffffffffff0;
      lVar46 = 0;
      for (uVar45 = (ulong)uVar40; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
        lVar46 = lVar46 + 1;
      }
      uVar45 = *(ulong *)(uVar47 + lVar46 * 8);
      uVar40 = uVar40 - 1 & uVar40;
      uVar42 = (ulong)uVar40;
      if (uVar40 != 0) {
        uVar41 = *(uint *)(local_2800 + lVar46 * 4);
        lVar46 = 0;
        for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
          lVar46 = lVar46 + 1;
        }
        uVar40 = uVar40 - 1 & uVar40;
        uVar43 = (ulong)uVar40;
        uVar42 = *(ulong *)(uVar47 + lVar46 * 8);
        uVar3 = *(uint *)(local_2800 + lVar46 * 4);
        if (uVar40 == 0) {
          if (uVar41 < uVar3) {
            *(ulong *)*pauVar52 = uVar42;
            *(uint *)(*pauVar52 + 8) = uVar3;
            pauVar52 = pauVar52 + 1;
          }
          else {
            *(ulong *)*pauVar52 = uVar45;
            *(uint *)(*pauVar52 + 8) = uVar41;
            uVar45 = uVar42;
            pauVar52 = pauVar52 + 1;
          }
        }
        else {
          auVar58._8_8_ = 0;
          auVar58._0_8_ = uVar45;
          auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(uVar41));
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar42;
          auVar67 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar3));
          lVar46 = 0;
          for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar46 = lVar46 + 1;
          }
          uVar40 = uVar40 - 1 & uVar40;
          uVar45 = (ulong)uVar40;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = *(ulong *)(uVar47 + lVar46 * 8);
          auVar59 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_2800 + lVar46 * 4)));
          auVar71 = vpcmpgtd_avx(auVar67,auVar58);
          if (uVar40 == 0) {
            auVar83 = vpshufd_avx(auVar71,0xaa);
            auVar71 = vblendvps_avx(auVar67,auVar58,auVar83);
            auVar58 = vblendvps_avx(auVar58,auVar67,auVar83);
            auVar67 = vpcmpgtd_avx(auVar59,auVar71);
            auVar83 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar59,auVar71,auVar83);
            auVar71 = vblendvps_avx(auVar71,auVar59,auVar83);
            auVar59 = vpcmpgtd_avx(auVar71,auVar58);
            auVar83 = vpshufd_avx(auVar59,0xaa);
            auVar59 = vblendvps_avx(auVar71,auVar58,auVar83);
            auVar58 = vblendvps_avx(auVar58,auVar71,auVar83);
            *pauVar52 = auVar58;
            pauVar52[1] = auVar59;
            uVar45 = auVar67._0_8_;
            pauVar52 = pauVar52 + 2;
          }
          else {
            lVar46 = 0;
            for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              lVar46 = lVar46 + 1;
            }
            uVar40 = uVar40 - 1 & uVar40;
            uVar45 = (ulong)uVar40;
            auVar83._8_8_ = 0;
            auVar83._0_8_ = *(ulong *)(uVar47 + lVar46 * 8);
            auVar83 = vpunpcklqdq_avx(auVar83,ZEXT416(*(uint *)(local_2800 + lVar46 * 4)));
            if (uVar40 == 0) {
              auVar53 = vpshufd_avx(auVar71,0xaa);
              auVar71 = vblendvps_avx(auVar67,auVar58,auVar53);
              auVar58 = vblendvps_avx(auVar58,auVar67,auVar53);
              auVar67 = vpcmpgtd_avx(auVar83,auVar59);
              auVar53 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar83,auVar59,auVar53);
              auVar59 = vblendvps_avx(auVar59,auVar83,auVar53);
              auVar83 = vpcmpgtd_avx(auVar59,auVar58);
              auVar53 = vpshufd_avx(auVar83,0xaa);
              auVar83 = vblendvps_avx(auVar59,auVar58,auVar53);
              auVar58 = vblendvps_avx(auVar58,auVar59,auVar53);
              auVar59 = vpcmpgtd_avx(auVar67,auVar71);
              auVar53 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar67,auVar71,auVar53);
              auVar67 = vblendvps_avx(auVar71,auVar67,auVar53);
              auVar71 = vpcmpgtd_avx(auVar83,auVar67);
              auVar53 = vpshufd_avx(auVar71,0xaa);
              auVar71 = vblendvps_avx(auVar83,auVar67,auVar53);
              auVar67 = vblendvps_avx(auVar67,auVar83,auVar53);
              *pauVar52 = auVar58;
              pauVar52[1] = auVar67;
              pauVar52[2] = auVar71;
              uVar45 = auVar59._0_8_;
              pauVar44 = pauVar52 + 3;
            }
            else {
              *pauVar52 = auVar58;
              pauVar52[1] = auVar67;
              pauVar52[2] = auVar59;
              pauVar44 = pauVar52 + 3;
              pauVar52[3] = auVar83;
              do {
                lVar46 = 0;
                for (uVar42 = uVar45; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000)
                {
                  lVar46 = lVar46 + 1;
                }
                auVar59._8_8_ = 0;
                auVar59._0_8_ = *(ulong *)(uVar47 + lVar46 * 8);
                auVar58 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_2800 + lVar46 * 4)));
                pauVar44[1] = auVar58;
                pauVar44 = pauVar44 + 1;
                uVar45 = uVar45 - 1 & uVar45;
              } while (uVar45 != 0);
              lVar46 = 0;
              while (pauVar44 != pauVar52) {
                auVar58 = pauVar52[1];
                uVar40 = vextractps_avx(auVar58,2);
                for (lVar48 = 0x10;
                    (lVar46 != lVar48 && (*(uint *)(pauVar52[-1] + lVar48 + 8) < uVar40));
                    lVar48 = lVar48 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar52 + lVar48) =
                       *(undefined1 (*) [16])(pauVar52[-1] + lVar48);
                }
                *(undefined1 (*) [16])(*pauVar52 + lVar48) = auVar58;
                lVar46 = lVar46 + -0x10;
                pauVar52 = pauVar52 + 1;
              }
              uVar45 = *(ulong *)*pauVar44;
            }
            auVar93 = ZEXT3264(local_28e0);
            pauVar52 = pauVar44;
          }
        }
      }
    }
    local_29a8 = (ulong)((uint)uVar45 & 0xf) - 8;
    uVar45 = uVar45 & 0xfffffffffffffff0;
    for (local_29a0 = 0; local_29a0 != local_29a8; local_29a0 = local_29a0 + 1) {
      lVar48 = local_29a0 * 0x60;
      pSVar4 = context->scene;
      ppfVar5 = (pSVar4->vertices).items;
      pfVar6 = ppfVar5[*(uint *)(uVar45 + 0x40 + lVar48)];
      auVar68._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x20 + lVar48));
      auVar68._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + lVar48));
      pfVar7 = ppfVar5[*(uint *)(uVar45 + 0x48 + lVar48)];
      auVar73._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x28 + lVar48));
      auVar73._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 8 + lVar48));
      pfVar8 = ppfVar5[*(uint *)(uVar45 + 0x44 + lVar48)];
      auVar84._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x24 + lVar48));
      auVar84._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 4 + lVar48));
      pfVar9 = ppfVar5[*(uint *)(uVar45 + 0x4c + lVar48)];
      auVar104._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 0x2c + lVar48));
      auVar104._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 0xc + lVar48));
      lVar46 = uVar45 + 0x40 + lVar48;
      local_23c0 = *(undefined8 *)(lVar46 + 0x10);
      uStack_23b8 = *(undefined8 *)(lVar46 + 0x18);
      uStack_23b0 = local_23c0;
      uStack_23a8 = uStack_23b8;
      lVar46 = uVar45 + 0x50 + lVar48;
      local_28c0 = *(undefined8 *)(lVar46 + 0x10);
      uStack_28b8 = *(undefined8 *)(lVar46 + 0x18);
      auVar71 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x10 + lVar48)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x18 + lVar48)));
      auVar58 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x10 + lVar48)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x18 + lVar48)));
      auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x14 + lVar48)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 0x1c + lVar48)));
      auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x14 + lVar48)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 0x1c + lVar48)));
      auVar83 = vunpcklps_avx(auVar58,auVar67);
      auVar53 = vunpcklps_avx(auVar71,auVar59);
      auVar58 = vunpckhps_avx(auVar71,auVar59);
      auVar59 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x30 + lVar48)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x38 + lVar48)));
      auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x30 + lVar48)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x38 + lVar48)));
      auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x34 + lVar48)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 0x3c + lVar48)));
      auVar71 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x34 + lVar48)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 0x3c + lVar48)));
      auVar71 = vunpcklps_avx(auVar67,auVar71);
      auVar19 = vunpcklps_avx(auVar59,auVar18);
      auVar67 = vunpckhps_avx(auVar59,auVar18);
      uStack_28b0 = local_28c0;
      uStack_28a8 = uStack_28b8;
      auVar60 = vunpcklps_avx(auVar84,auVar104);
      auVar72 = vunpcklps_avx(auVar68,auVar73);
      auVar20 = vunpcklps_avx(auVar72,auVar60);
      auVar60 = vunpckhps_avx(auVar72,auVar60);
      auVar72 = vunpckhps_avx(auVar84,auVar104);
      auVar65 = vunpckhps_avx(auVar68,auVar73);
      auVar72 = vunpcklps_avx(auVar65,auVar72);
      auVar74._16_16_ = auVar53;
      auVar74._0_16_ = auVar53;
      auVar85._16_16_ = auVar58;
      auVar85._0_16_ = auVar58;
      auVar61._16_16_ = auVar83;
      auVar61._0_16_ = auVar83;
      auVar138._16_16_ = auVar19;
      auVar138._0_16_ = auVar19;
      auVar77._16_16_ = auVar67;
      auVar77._0_16_ = auVar67;
      uVar119 = *(undefined4 *)(ray + k * 4);
      auVar96._4_4_ = uVar119;
      auVar96._0_4_ = uVar119;
      auVar96._8_4_ = uVar119;
      auVar96._12_4_ = uVar119;
      auVar96._16_4_ = uVar119;
      auVar96._20_4_ = uVar119;
      auVar96._24_4_ = uVar119;
      auVar96._28_4_ = uVar119;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar112._4_4_ = uVar119;
      auVar112._0_4_ = uVar119;
      auVar112._8_4_ = uVar119;
      auVar112._12_4_ = uVar119;
      auVar112._16_4_ = uVar119;
      auVar112._20_4_ = uVar119;
      auVar112._24_4_ = uVar119;
      auVar112._28_4_ = uVar119;
      auVar54._16_16_ = auVar71;
      auVar54._0_16_ = auVar71;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar128._4_4_ = uVar119;
      auVar128._0_4_ = uVar119;
      auVar128._8_4_ = uVar119;
      auVar128._12_4_ = uVar119;
      auVar128._16_4_ = uVar119;
      auVar128._20_4_ = uVar119;
      auVar128._24_4_ = uVar119;
      auVar128._28_4_ = uVar119;
      auVar20 = vsubps_avx(auVar20,auVar96);
      auVar12 = vsubps_avx(auVar60,auVar112);
      local_2940 = vsubps_avx(auVar72,auVar128);
      auVar60 = vsubps_avx(auVar74,auVar96);
      auVar72 = vsubps_avx(auVar85,auVar112);
      auVar65 = vsubps_avx(auVar61,auVar128);
      auVar13 = vsubps_avx(auVar138,auVar96);
      auVar14 = vsubps_avx(auVar77,auVar112);
      auVar15 = vsubps_avx(auVar54,auVar128);
      local_23e0 = vsubps_avx(auVar13,auVar20);
      local_2420 = vsubps_avx(auVar14,auVar12);
      local_2400 = vsubps_avx(auVar15,local_2940);
      auVar55._0_4_ = auVar20._0_4_ + auVar13._0_4_;
      auVar55._4_4_ = auVar20._4_4_ + auVar13._4_4_;
      auVar55._8_4_ = auVar20._8_4_ + auVar13._8_4_;
      auVar55._12_4_ = auVar20._12_4_ + auVar13._12_4_;
      auVar55._16_4_ = auVar20._16_4_ + auVar13._16_4_;
      auVar55._20_4_ = auVar20._20_4_ + auVar13._20_4_;
      auVar55._24_4_ = auVar20._24_4_ + auVar13._24_4_;
      auVar55._28_4_ = auVar20._28_4_ + auVar13._28_4_;
      auVar69._0_4_ = auVar12._0_4_ + auVar14._0_4_;
      auVar69._4_4_ = auVar12._4_4_ + auVar14._4_4_;
      auVar69._8_4_ = auVar12._8_4_ + auVar14._8_4_;
      auVar69._12_4_ = auVar12._12_4_ + auVar14._12_4_;
      auVar69._16_4_ = auVar12._16_4_ + auVar14._16_4_;
      auVar69._20_4_ = auVar12._20_4_ + auVar14._20_4_;
      auVar69._24_4_ = auVar12._24_4_ + auVar14._24_4_;
      auVar69._28_4_ = auVar12._28_4_ + auVar14._28_4_;
      fVar127 = local_2940._0_4_;
      auVar78._0_4_ = auVar15._0_4_ + fVar127;
      fVar134 = local_2940._4_4_;
      auVar78._4_4_ = auVar15._4_4_ + fVar134;
      fVar137 = local_2940._8_4_;
      auVar78._8_4_ = auVar15._8_4_ + fVar137;
      fVar107 = local_2940._12_4_;
      auVar78._12_4_ = auVar15._12_4_ + fVar107;
      fVar111 = local_2940._16_4_;
      auVar78._16_4_ = auVar15._16_4_ + fVar111;
      fVar118 = local_2940._20_4_;
      auVar78._20_4_ = auVar15._20_4_ + fVar118;
      fVar110 = local_2940._24_4_;
      auVar78._24_4_ = auVar15._24_4_ + fVar110;
      fVar82 = local_2940._28_4_;
      auVar78._28_4_ = auVar15._28_4_ + fVar82;
      auVar16._4_4_ = local_2400._4_4_ * auVar69._4_4_;
      auVar16._0_4_ = local_2400._0_4_ * auVar69._0_4_;
      auVar16._8_4_ = local_2400._8_4_ * auVar69._8_4_;
      auVar16._12_4_ = local_2400._12_4_ * auVar69._12_4_;
      auVar16._16_4_ = local_2400._16_4_ * auVar69._16_4_;
      auVar16._20_4_ = local_2400._20_4_ * auVar69._20_4_;
      auVar16._24_4_ = local_2400._24_4_ * auVar69._24_4_;
      auVar16._28_4_ = uVar119;
      auVar67 = vfmsub231ps_fma(auVar16,local_2420,auVar78);
      auVar17._4_4_ = local_23e0._4_4_ * auVar78._4_4_;
      auVar17._0_4_ = local_23e0._0_4_ * auVar78._0_4_;
      auVar17._8_4_ = local_23e0._8_4_ * auVar78._8_4_;
      auVar17._12_4_ = local_23e0._12_4_ * auVar78._12_4_;
      auVar17._16_4_ = local_23e0._16_4_ * auVar78._16_4_;
      auVar17._20_4_ = local_23e0._20_4_ * auVar78._20_4_;
      auVar17._24_4_ = local_23e0._24_4_ * auVar78._24_4_;
      auVar17._28_4_ = auVar78._28_4_;
      auVar58 = vfmsub231ps_fma(auVar17,local_2400,auVar55);
      auVar21._4_4_ = local_2420._4_4_ * auVar55._4_4_;
      auVar21._0_4_ = local_2420._0_4_ * auVar55._0_4_;
      auVar21._8_4_ = local_2420._8_4_ * auVar55._8_4_;
      auVar21._12_4_ = local_2420._12_4_ * auVar55._12_4_;
      auVar21._16_4_ = local_2420._16_4_ * auVar55._16_4_;
      auVar21._20_4_ = local_2420._20_4_ * auVar55._20_4_;
      auVar21._24_4_ = local_2420._24_4_ * auVar55._24_4_;
      auVar21._28_4_ = auVar55._28_4_;
      auVar71 = vfmsub231ps_fma(auVar21,local_23e0,auVar69);
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar113._4_4_ = uVar119;
      auVar113._0_4_ = uVar119;
      auVar113._8_4_ = uVar119;
      auVar113._12_4_ = uVar119;
      auVar113._16_4_ = uVar119;
      auVar113._20_4_ = uVar119;
      auVar113._24_4_ = uVar119;
      auVar113._28_4_ = uVar119;
      local_2460 = *(float *)(ray + k * 4 + 0x60);
      auVar22._4_4_ = local_2460 * auVar71._4_4_;
      auVar22._0_4_ = local_2460 * auVar71._0_4_;
      auVar22._8_4_ = local_2460 * auVar71._8_4_;
      auVar22._12_4_ = local_2460 * auVar71._12_4_;
      auVar22._16_4_ = local_2460 * 0.0;
      auVar22._20_4_ = local_2460 * 0.0;
      auVar22._24_4_ = local_2460 * 0.0;
      auVar22._28_4_ = auVar69._28_4_;
      auVar58 = vfmadd231ps_fma(auVar22,auVar113,ZEXT1632(auVar58));
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_2440._4_4_ = uVar119;
      local_2440._0_4_ = uVar119;
      local_2440._8_4_ = uVar119;
      local_2440._12_4_ = uVar119;
      local_2440._16_4_ = uVar119;
      local_2440._20_4_ = uVar119;
      local_2440._24_4_ = uVar119;
      local_2440._28_4_ = uVar119;
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),local_2440,ZEXT1632(auVar67));
      local_2480 = vsubps_avx(auVar12,auVar72);
      local_24a0 = vsubps_avx(local_2940,auVar65);
      auVar135._0_4_ = auVar12._0_4_ + auVar72._0_4_;
      auVar135._4_4_ = auVar12._4_4_ + auVar72._4_4_;
      auVar135._8_4_ = auVar12._8_4_ + auVar72._8_4_;
      auVar135._12_4_ = auVar12._12_4_ + auVar72._12_4_;
      auVar135._16_4_ = auVar12._16_4_ + auVar72._16_4_;
      auVar135._20_4_ = auVar12._20_4_ + auVar72._20_4_;
      auVar135._24_4_ = auVar12._24_4_ + auVar72._24_4_;
      auVar135._28_4_ = auVar12._28_4_ + auVar72._28_4_;
      auVar79._0_4_ = fVar127 + auVar65._0_4_;
      auVar79._4_4_ = fVar134 + auVar65._4_4_;
      auVar79._8_4_ = fVar137 + auVar65._8_4_;
      auVar79._12_4_ = fVar107 + auVar65._12_4_;
      auVar79._16_4_ = fVar111 + auVar65._16_4_;
      auVar79._20_4_ = fVar118 + auVar65._20_4_;
      auVar79._24_4_ = fVar110 + auVar65._24_4_;
      fVar95 = auVar65._28_4_;
      auVar79._28_4_ = fVar82 + fVar95;
      fVar87 = local_24a0._0_4_;
      fVar89 = local_24a0._4_4_;
      auVar23._4_4_ = auVar135._4_4_ * fVar89;
      auVar23._0_4_ = auVar135._0_4_ * fVar87;
      fVar114 = local_24a0._8_4_;
      auVar23._8_4_ = auVar135._8_4_ * fVar114;
      fVar117 = local_24a0._12_4_;
      auVar23._12_4_ = auVar135._12_4_ * fVar117;
      fVar123 = local_24a0._16_4_;
      auVar23._16_4_ = auVar135._16_4_ * fVar123;
      fVar126 = local_24a0._20_4_;
      auVar23._20_4_ = auVar135._20_4_ * fVar126;
      fVar131 = local_24a0._24_4_;
      auVar23._24_4_ = auVar135._24_4_ * fVar131;
      auVar23._28_4_ = fVar82;
      auVar71 = vfmsub231ps_fma(auVar23,local_2480,auVar79);
      auVar16 = vsubps_avx(auVar20,auVar60);
      fVar82 = auVar16._0_4_;
      fVar90 = auVar16._4_4_;
      auVar24._4_4_ = auVar79._4_4_ * fVar90;
      auVar24._0_4_ = auVar79._0_4_ * fVar82;
      fVar115 = auVar16._8_4_;
      auVar24._8_4_ = auVar79._8_4_ * fVar115;
      fVar121 = auVar16._12_4_;
      auVar24._12_4_ = auVar79._12_4_ * fVar121;
      fVar124 = auVar16._16_4_;
      auVar24._16_4_ = auVar79._16_4_ * fVar124;
      fVar129 = auVar16._20_4_;
      auVar24._20_4_ = auVar79._20_4_ * fVar129;
      fVar132 = auVar16._24_4_;
      auVar24._24_4_ = auVar79._24_4_ * fVar132;
      auVar24._28_4_ = auVar79._28_4_;
      auVar108._0_4_ = auVar20._0_4_ + auVar60._0_4_;
      auVar108._4_4_ = auVar20._4_4_ + auVar60._4_4_;
      auVar108._8_4_ = auVar20._8_4_ + auVar60._8_4_;
      auVar108._12_4_ = auVar20._12_4_ + auVar60._12_4_;
      auVar108._16_4_ = auVar20._16_4_ + auVar60._16_4_;
      auVar108._20_4_ = auVar20._20_4_ + auVar60._20_4_;
      auVar108._24_4_ = auVar20._24_4_ + auVar60._24_4_;
      auVar108._28_4_ = auVar20._28_4_ + auVar60._28_4_;
      auVar67 = vfmsub231ps_fma(auVar24,local_24a0,auVar108);
      fVar88 = local_2480._0_4_;
      fVar91 = local_2480._4_4_;
      auVar25._4_4_ = auVar108._4_4_ * fVar91;
      auVar25._0_4_ = auVar108._0_4_ * fVar88;
      fVar116 = local_2480._8_4_;
      auVar25._8_4_ = auVar108._8_4_ * fVar116;
      fVar122 = local_2480._12_4_;
      auVar25._12_4_ = auVar108._12_4_ * fVar122;
      fVar125 = local_2480._16_4_;
      auVar25._16_4_ = auVar108._16_4_ * fVar125;
      fVar130 = local_2480._20_4_;
      auVar25._20_4_ = auVar108._20_4_ * fVar130;
      fVar133 = local_2480._24_4_;
      auVar25._24_4_ = auVar108._24_4_ * fVar133;
      auVar25._28_4_ = local_24a0._28_4_;
      auVar59 = vfmsub231ps_fma(auVar25,auVar16,auVar135);
      auVar26._4_4_ = auVar59._4_4_ * local_2460;
      auVar26._0_4_ = auVar59._0_4_ * local_2460;
      auVar26._8_4_ = auVar59._8_4_ * local_2460;
      auVar26._12_4_ = auVar59._12_4_ * local_2460;
      auVar26._16_4_ = local_2460 * 0.0;
      auVar26._20_4_ = local_2460 * 0.0;
      auVar26._24_4_ = local_2460 * 0.0;
      auVar26._28_4_ = auVar135._28_4_;
      auVar67 = vfmadd231ps_fma(auVar26,auVar113,ZEXT1632(auVar67));
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),local_2440,ZEXT1632(auVar71));
      auVar17 = vsubps_avx(auVar60,auVar13);
      auVar75._0_4_ = auVar60._0_4_ + auVar13._0_4_;
      auVar75._4_4_ = auVar60._4_4_ + auVar13._4_4_;
      auVar75._8_4_ = auVar60._8_4_ + auVar13._8_4_;
      auVar75._12_4_ = auVar60._12_4_ + auVar13._12_4_;
      auVar75._16_4_ = auVar60._16_4_ + auVar13._16_4_;
      auVar75._20_4_ = auVar60._20_4_ + auVar13._20_4_;
      auVar75._24_4_ = auVar60._24_4_ + auVar13._24_4_;
      auVar75._28_4_ = auVar60._28_4_ + auVar13._28_4_;
      auVar13 = vsubps_avx(auVar72,auVar14);
      auVar86._0_4_ = auVar72._0_4_ + auVar14._0_4_;
      auVar86._4_4_ = auVar72._4_4_ + auVar14._4_4_;
      auVar86._8_4_ = auVar72._8_4_ + auVar14._8_4_;
      auVar86._12_4_ = auVar72._12_4_ + auVar14._12_4_;
      auVar86._16_4_ = auVar72._16_4_ + auVar14._16_4_;
      auVar86._20_4_ = auVar72._20_4_ + auVar14._20_4_;
      auVar86._24_4_ = auVar72._24_4_ + auVar14._24_4_;
      auVar86._28_4_ = auVar72._28_4_ + auVar14._28_4_;
      auVar14 = vsubps_avx(auVar65,auVar15);
      auVar62._0_4_ = auVar65._0_4_ + auVar15._0_4_;
      auVar62._4_4_ = auVar65._4_4_ + auVar15._4_4_;
      auVar62._8_4_ = auVar65._8_4_ + auVar15._8_4_;
      auVar62._12_4_ = auVar65._12_4_ + auVar15._12_4_;
      auVar62._16_4_ = auVar65._16_4_ + auVar15._16_4_;
      auVar62._20_4_ = auVar65._20_4_ + auVar15._20_4_;
      auVar62._24_4_ = auVar65._24_4_ + auVar15._24_4_;
      auVar62._28_4_ = fVar95 + auVar15._28_4_;
      auVar27._4_4_ = auVar14._4_4_ * auVar86._4_4_;
      auVar27._0_4_ = auVar14._0_4_ * auVar86._0_4_;
      auVar27._8_4_ = auVar14._8_4_ * auVar86._8_4_;
      auVar27._12_4_ = auVar14._12_4_ * auVar86._12_4_;
      auVar27._16_4_ = auVar14._16_4_ * auVar86._16_4_;
      auVar27._20_4_ = auVar14._20_4_ * auVar86._20_4_;
      auVar27._24_4_ = auVar14._24_4_ * auVar86._24_4_;
      auVar27._28_4_ = fVar95;
      auVar59 = vfmsub231ps_fma(auVar27,auVar13,auVar62);
      auVar28._4_4_ = auVar62._4_4_ * auVar17._4_4_;
      auVar28._0_4_ = auVar62._0_4_ * auVar17._0_4_;
      auVar28._8_4_ = auVar62._8_4_ * auVar17._8_4_;
      auVar28._12_4_ = auVar62._12_4_ * auVar17._12_4_;
      auVar28._16_4_ = auVar62._16_4_ * auVar17._16_4_;
      auVar28._20_4_ = auVar62._20_4_ * auVar17._20_4_;
      auVar28._24_4_ = auVar62._24_4_ * auVar17._24_4_;
      auVar28._28_4_ = auVar62._28_4_;
      auVar71 = vfmsub231ps_fma(auVar28,auVar14,auVar75);
      auVar29._4_4_ = auVar13._4_4_ * auVar75._4_4_;
      auVar29._0_4_ = auVar13._0_4_ * auVar75._0_4_;
      auVar29._8_4_ = auVar13._8_4_ * auVar75._8_4_;
      auVar29._12_4_ = auVar13._12_4_ * auVar75._12_4_;
      auVar29._16_4_ = auVar13._16_4_ * auVar75._16_4_;
      auVar29._20_4_ = auVar13._20_4_ * auVar75._20_4_;
      auVar29._24_4_ = auVar13._24_4_ * auVar75._24_4_;
      auVar29._28_4_ = auVar75._28_4_;
      auVar83 = vfmsub231ps_fma(auVar29,auVar17,auVar86);
      fStack_245c = local_2460;
      fStack_2458 = local_2460;
      fStack_2454 = local_2460;
      fStack_2450 = local_2460;
      fStack_244c = local_2460;
      fStack_2448 = local_2460;
      fStack_2444 = local_2460;
      auVar76._0_4_ = local_2460 * auVar83._0_4_;
      auVar76._4_4_ = local_2460 * auVar83._4_4_;
      auVar76._8_4_ = local_2460 * auVar83._8_4_;
      auVar76._12_4_ = local_2460 * auVar83._12_4_;
      auVar76._16_4_ = local_2460 * 0.0;
      auVar76._20_4_ = local_2460 * 0.0;
      auVar76._24_4_ = local_2460 * 0.0;
      auVar76._28_4_ = 0;
      auVar71 = vfmadd231ps_fma(auVar76,auVar113,ZEXT1632(auVar71));
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_2440,ZEXT1632(auVar59));
      local_27c0 = ZEXT1632(CONCAT412(auVar71._12_4_ + auVar67._12_4_ + auVar58._12_4_,
                                      CONCAT48(auVar71._8_4_ + auVar67._8_4_ + auVar58._8_4_,
                                               CONCAT44(auVar71._4_4_ +
                                                        auVar67._4_4_ + auVar58._4_4_,
                                                        auVar71._0_4_ +
                                                        auVar67._0_4_ + auVar58._0_4_))));
      auVar63._8_4_ = 0x7fffffff;
      auVar63._0_8_ = 0x7fffffff7fffffff;
      auVar63._12_4_ = 0x7fffffff;
      auVar63._16_4_ = 0x7fffffff;
      auVar63._20_4_ = 0x7fffffff;
      auVar63._24_4_ = 0x7fffffff;
      auVar63._28_4_ = 0x7fffffff;
      local_27e0 = ZEXT1632(auVar67);
      auVar60 = vminps_avx(ZEXT1632(auVar58),local_27e0);
      auVar60 = vminps_avx(auVar60,ZEXT1632(auVar71));
      local_24e0 = vandps_avx(local_27c0,auVar63);
      fVar95 = local_24e0._0_4_ * 1.1920929e-07;
      fVar98 = local_24e0._4_4_ * 1.1920929e-07;
      auVar30._4_4_ = fVar98;
      auVar30._0_4_ = fVar95;
      fVar99 = local_24e0._8_4_ * 1.1920929e-07;
      auVar30._8_4_ = fVar99;
      fVar100 = local_24e0._12_4_ * 1.1920929e-07;
      auVar30._12_4_ = fVar100;
      fVar101 = local_24e0._16_4_ * 1.1920929e-07;
      auVar30._16_4_ = fVar101;
      fVar102 = local_24e0._20_4_ * 1.1920929e-07;
      auVar30._20_4_ = fVar102;
      fVar103 = local_24e0._24_4_ * 1.1920929e-07;
      auVar30._24_4_ = fVar103;
      auVar30._28_4_ = 0x34000000;
      auVar92._0_8_ = CONCAT44(fVar98,fVar95) ^ 0x8000000080000000;
      auVar92._8_4_ = -fVar99;
      auVar92._12_4_ = -fVar100;
      auVar92._16_4_ = -fVar101;
      auVar92._20_4_ = -fVar102;
      auVar92._24_4_ = -fVar103;
      auVar92._28_4_ = 0xb4000000;
      auVar60 = vcmpps_avx(auVar60,auVar92,5);
      local_24c0 = ZEXT1632(auVar58);
      auVar65 = vmaxps_avx(ZEXT1632(auVar58),local_27e0);
      auVar72 = vmaxps_avx(auVar65,ZEXT1632(auVar71));
      auVar72 = vcmpps_avx(auVar72,auVar30,2);
      auVar72 = vorps_avx(auVar60,auVar72);
      if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0x7f,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar72 >> 0xbf,0) != '\0') ||
          (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar72[0x1f] < '\0') {
        auVar31._4_4_ = fVar91 * local_2400._4_4_;
        auVar31._0_4_ = fVar88 * local_2400._0_4_;
        auVar31._8_4_ = fVar116 * local_2400._8_4_;
        auVar31._12_4_ = fVar122 * local_2400._12_4_;
        auVar31._16_4_ = fVar125 * local_2400._16_4_;
        auVar31._20_4_ = fVar130 * local_2400._20_4_;
        auVar31._24_4_ = fVar133 * local_2400._24_4_;
        auVar31._28_4_ = auVar60._28_4_;
        auVar32._4_4_ = local_2420._4_4_ * fVar90;
        auVar32._0_4_ = local_2420._0_4_ * fVar82;
        auVar32._8_4_ = local_2420._8_4_ * fVar115;
        auVar32._12_4_ = local_2420._12_4_ * fVar121;
        auVar32._16_4_ = local_2420._16_4_ * fVar124;
        auVar32._20_4_ = local_2420._20_4_ * fVar129;
        auVar32._24_4_ = local_2420._24_4_ * fVar132;
        auVar32._28_4_ = 0x34000000;
        auVar71 = vfmsub213ps_fma(local_2420,local_24a0,auVar31);
        auVar33._4_4_ = auVar13._4_4_ * fVar89;
        auVar33._0_4_ = auVar13._0_4_ * fVar87;
        auVar33._8_4_ = auVar13._8_4_ * fVar114;
        auVar33._12_4_ = auVar13._12_4_ * fVar117;
        auVar33._16_4_ = auVar13._16_4_ * fVar123;
        auVar33._20_4_ = auVar13._20_4_ * fVar126;
        auVar33._24_4_ = auVar13._24_4_ * fVar131;
        auVar33._28_4_ = auVar65._28_4_;
        auVar34._4_4_ = auVar14._4_4_ * fVar90;
        auVar34._0_4_ = auVar14._0_4_ * fVar82;
        auVar34._8_4_ = auVar14._8_4_ * fVar115;
        auVar34._12_4_ = auVar14._12_4_ * fVar121;
        auVar34._16_4_ = auVar14._16_4_ * fVar124;
        auVar34._20_4_ = auVar14._20_4_ * fVar129;
        auVar34._24_4_ = auVar14._24_4_ * fVar132;
        auVar34._28_4_ = local_24e0._28_4_;
        auVar59 = vfmsub213ps_fma(auVar14,local_2480,auVar33);
        auVar60 = vandps_avx(auVar31,auVar63);
        auVar65 = vandps_avx(auVar33,auVar63);
        auVar60 = vcmpps_avx(auVar60,auVar65,1);
        local_27a0 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar71),auVar60);
        auVar35._4_4_ = fVar91 * auVar17._4_4_;
        auVar35._0_4_ = fVar88 * auVar17._0_4_;
        auVar35._8_4_ = fVar116 * auVar17._8_4_;
        auVar35._12_4_ = fVar122 * auVar17._12_4_;
        auVar35._16_4_ = fVar125 * auVar17._16_4_;
        auVar35._20_4_ = fVar130 * auVar17._20_4_;
        auVar35._24_4_ = fVar133 * auVar17._24_4_;
        auVar35._28_4_ = auVar60._28_4_;
        auVar71 = vfmsub213ps_fma(auVar17,local_24a0,auVar34);
        auVar36._4_4_ = local_23e0._4_4_ * fVar89;
        auVar36._0_4_ = local_23e0._0_4_ * fVar87;
        auVar36._8_4_ = local_23e0._8_4_ * fVar114;
        auVar36._12_4_ = local_23e0._12_4_ * fVar117;
        auVar36._16_4_ = local_23e0._16_4_ * fVar123;
        auVar36._20_4_ = local_23e0._20_4_ * fVar126;
        auVar36._24_4_ = local_23e0._24_4_ * fVar131;
        auVar36._28_4_ = auVar65._28_4_;
        auVar59 = vfmsub213ps_fma(local_2400,auVar16,auVar36);
        auVar60 = vandps_avx(auVar36,auVar63);
        auVar65 = vandps_avx(auVar34,auVar63);
        auVar60 = vcmpps_avx(auVar60,auVar65,1);
        local_2780 = vblendvps_avx(ZEXT1632(auVar71),ZEXT1632(auVar59),auVar60);
        auVar71 = vfmsub213ps_fma(local_23e0,local_2480,auVar32);
        auVar59 = vfmsub213ps_fma(auVar13,auVar16,auVar35);
        auVar60 = vandps_avx(auVar32,auVar63);
        auVar65 = vandps_avx(auVar35,auVar63);
        auVar65 = vcmpps_avx(auVar60,auVar65,1);
        local_2760 = vblendvps_avx(ZEXT1632(auVar59),ZEXT1632(auVar71),auVar65);
        auVar71 = vpackssdw_avx(auVar72._0_16_,auVar72._16_16_);
        fVar82 = local_2760._0_4_;
        auVar64._0_4_ = fVar82 * local_2460;
        fVar95 = local_2760._4_4_;
        auVar64._4_4_ = fVar95 * local_2460;
        fVar87 = local_2760._8_4_;
        auVar64._8_4_ = fVar87 * local_2460;
        fVar88 = local_2760._12_4_;
        auVar64._12_4_ = fVar88 * local_2460;
        fVar89 = local_2760._16_4_;
        auVar64._16_4_ = fVar89 * local_2460;
        fVar90 = local_2760._20_4_;
        auVar64._20_4_ = fVar90 * local_2460;
        fVar91 = local_2760._24_4_;
        auVar64._24_4_ = fVar91 * local_2460;
        auVar64._28_4_ = 0;
        auVar59 = vfmadd213ps_fma(auVar113,local_2780,auVar64);
        auVar59 = vfmadd213ps_fma(local_2440,local_27a0,ZEXT1632(auVar59));
        auVar65 = ZEXT1632(CONCAT412(auVar59._12_4_ + auVar59._12_4_,
                                     CONCAT48(auVar59._8_4_ + auVar59._8_4_,
                                              CONCAT44(auVar59._4_4_ + auVar59._4_4_,
                                                       auVar59._0_4_ + auVar59._0_4_))));
        auVar37._4_4_ = fVar95 * fVar134;
        auVar37._0_4_ = fVar82 * fVar127;
        auVar37._8_4_ = fVar87 * fVar137;
        auVar37._12_4_ = fVar88 * fVar107;
        auVar37._16_4_ = fVar89 * fVar111;
        auVar37._20_4_ = fVar90 * fVar118;
        auVar37._24_4_ = fVar91 * fVar110;
        auVar37._28_4_ = auVar60._28_4_;
        auVar59 = vfmadd213ps_fma(auVar12,local_2780,auVar37);
        auVar83 = vfmadd213ps_fma(auVar20,local_27a0,ZEXT1632(auVar59));
        auVar60 = vrcpps_avx(auVar65);
        auVar109._8_4_ = 0x3f800000;
        auVar109._0_8_ = 0x3f8000003f800000;
        auVar109._12_4_ = 0x3f800000;
        auVar109._16_4_ = 0x3f800000;
        auVar109._20_4_ = 0x3f800000;
        auVar109._24_4_ = 0x3f800000;
        auVar109._28_4_ = 0x3f800000;
        auVar59 = vfnmadd213ps_fma(auVar60,auVar65,auVar109);
        auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar60,auVar60);
        local_26e0._28_4_ = 0x3f800000;
        local_26e0._0_28_ =
             ZEXT1628(CONCAT412(auVar59._12_4_ * (auVar83._12_4_ + auVar83._12_4_),
                                CONCAT48(auVar59._8_4_ * (auVar83._8_4_ + auVar83._8_4_),
                                         CONCAT44(auVar59._4_4_ * (auVar83._4_4_ + auVar83._4_4_),
                                                  auVar59._0_4_ * (auVar83._0_4_ + auVar83._0_4_))))
                     );
        auVar57 = ZEXT3264(local_26e0);
        uVar119 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar80._4_4_ = uVar119;
        auVar80._0_4_ = uVar119;
        auVar80._8_4_ = uVar119;
        auVar80._12_4_ = uVar119;
        auVar80._16_4_ = uVar119;
        auVar80._20_4_ = uVar119;
        auVar80._24_4_ = uVar119;
        auVar80._28_4_ = uVar119;
        uVar119 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar120._4_4_ = uVar119;
        auVar120._0_4_ = uVar119;
        auVar120._8_4_ = uVar119;
        auVar120._12_4_ = uVar119;
        auVar120._16_4_ = uVar119;
        auVar120._20_4_ = uVar119;
        auVar120._24_4_ = uVar119;
        auVar120._28_4_ = uVar119;
        auVar93 = ZEXT3264(auVar120);
        auVar60 = vcmpps_avx(auVar80,local_26e0,2);
        auVar72 = vcmpps_avx(local_26e0,auVar120,2);
        auVar60 = vandps_avx(auVar72,auVar60);
        auVar59 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
        auVar71 = vpand_avx(auVar59,auVar71);
        auVar60 = vpmovsxwd_avx2(auVar71);
        if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar60 >> 0x7f,0) != '\0') ||
              (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar60 >> 0xbf,0) != '\0') ||
            (auVar60 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar60[0x1f] < '\0') {
          auVar60 = vcmpps_avx(auVar65,_DAT_01f7b000,4);
          auVar59 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
          auVar71 = vpand_avx(auVar71,auVar59);
          local_2960 = vpmovsxwd_avx2(auVar71);
          if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_2960 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_2960 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_2960 >> 0x7f,0) != '\0') ||
                (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_2960 >> 0xbf,0) != '\0') ||
              (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_2960[0x1f] < '\0') {
            local_2800 = ZEXT1632(auVar58);
            local_2740 = local_2960;
            local_2660 = local_2620;
            auVar60 = vrcpps_avx(local_27c0);
            auVar105._8_4_ = 0x3f800000;
            auVar105._0_8_ = 0x3f8000003f800000;
            auVar105._12_4_ = 0x3f800000;
            auVar105._16_4_ = 0x3f800000;
            auVar105._20_4_ = 0x3f800000;
            auVar105._24_4_ = 0x3f800000;
            auVar105._28_4_ = 0x3f800000;
            auVar59 = vfnmadd213ps_fma(local_27c0,auVar60,auVar105);
            auVar59 = vfmadd132ps_fma(ZEXT1632(auVar59),auVar60,auVar60);
            auVar81._8_4_ = 0x219392ef;
            auVar81._0_8_ = 0x219392ef219392ef;
            auVar81._12_4_ = 0x219392ef;
            auVar81._16_4_ = 0x219392ef;
            auVar81._20_4_ = 0x219392ef;
            auVar81._24_4_ = 0x219392ef;
            auVar81._28_4_ = 0x219392ef;
            auVar60 = vcmpps_avx(local_24e0,auVar81,5);
            auVar60 = vandps_avx(auVar60,ZEXT1632(auVar59));
            auVar38._4_4_ = auVar58._4_4_ * auVar60._4_4_;
            auVar38._0_4_ = auVar58._0_4_ * auVar60._0_4_;
            auVar38._8_4_ = auVar58._8_4_ * auVar60._8_4_;
            auVar38._12_4_ = auVar58._12_4_ * auVar60._12_4_;
            auVar38._16_4_ = auVar60._16_4_ * 0.0;
            auVar38._20_4_ = auVar60._20_4_ * 0.0;
            auVar38._24_4_ = auVar60._24_4_ * 0.0;
            auVar38._28_4_ = 0;
            auVar72 = vminps_avx(auVar38,auVar105);
            auVar39._4_4_ = auVar67._4_4_ * auVar60._4_4_;
            auVar39._0_4_ = auVar67._0_4_ * auVar60._0_4_;
            auVar39._8_4_ = auVar67._8_4_ * auVar60._8_4_;
            auVar39._12_4_ = auVar67._12_4_ * auVar60._12_4_;
            auVar39._16_4_ = auVar60._16_4_ * 0.0;
            auVar39._20_4_ = auVar60._20_4_ * 0.0;
            auVar39._24_4_ = auVar60._24_4_ * 0.0;
            auVar39._28_4_ = auVar16._28_4_;
            auVar60 = vminps_avx(auVar39,auVar105);
            auVar65 = vsubps_avx(auVar105,auVar72);
            auVar20 = vsubps_avx(auVar105,auVar60);
            local_2700 = vblendvps_avx(auVar60,auVar65,local_2620);
            local_2720 = vblendvps_avx(auVar72,auVar20,local_2620);
            local_26c0[0] = local_27a0._0_4_ * (float)local_2640._0_4_;
            local_26c0[1] = local_27a0._4_4_ * (float)local_2640._4_4_;
            local_26c0[2] = local_27a0._8_4_ * fStack_2638;
            local_26c0[3] = local_27a0._12_4_ * fStack_2634;
            fStack_26b0 = local_27a0._16_4_ * fStack_2630;
            fStack_26ac = local_27a0._20_4_ * fStack_262c;
            fStack_26a8 = local_27a0._24_4_ * fStack_2628;
            uStack_26a4 = local_2720._28_4_;
            local_26a0[0] = (float)local_2640._0_4_ * local_2780._0_4_;
            local_26a0[1] = (float)local_2640._4_4_ * local_2780._4_4_;
            local_26a0[2] = fStack_2638 * local_2780._8_4_;
            local_26a0[3] = fStack_2634 * local_2780._12_4_;
            fStack_2690 = fStack_2630 * local_2780._16_4_;
            fStack_268c = fStack_262c * local_2780._20_4_;
            fStack_2688 = fStack_2628 * local_2780._24_4_;
            uStack_2684 = local_2700._28_4_;
            local_2680[0] = (float)local_2640._0_4_ * fVar82;
            local_2680[1] = (float)local_2640._4_4_ * fVar95;
            local_2680[2] = fStack_2638 * fVar87;
            local_2680[3] = fStack_2634 * fVar88;
            fStack_2670 = fStack_2630 * fVar89;
            fStack_266c = fStack_262c * fVar90;
            fStack_2668 = fStack_2628 * fVar91;
            uStack_2664 = uStack_2624;
            auVar60 = vpmovsxwd_avx2(auVar71);
            auVar70._8_4_ = 0x7f800000;
            auVar70._0_8_ = 0x7f8000007f800000;
            auVar70._12_4_ = 0x7f800000;
            auVar70._16_4_ = 0x7f800000;
            auVar70._20_4_ = 0x7f800000;
            auVar70._24_4_ = 0x7f800000;
            auVar70._28_4_ = 0x7f800000;
            auVar60 = vblendvps_avx(auVar70,local_26e0,auVar60);
            auVar72 = vshufps_avx(auVar60,auVar60,0xb1);
            auVar72 = vminps_avx(auVar60,auVar72);
            auVar65 = vshufpd_avx(auVar72,auVar72,5);
            auVar72 = vminps_avx(auVar72,auVar65);
            auVar65 = vpermpd_avx2(auVar72,0x4e);
            auVar72 = vminps_avx(auVar72,auVar65);
            auVar60 = vcmpps_avx(auVar60,auVar72,0);
            auVar58 = vpackssdw_avx(auVar60._0_16_,auVar60._16_16_);
            auVar58 = vpand_avx(auVar58,auVar71);
            auVar60 = vpmovsxwd_avx2(auVar58);
            if ((((((((auVar60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar60 >> 0x7f,0) == '\0') &&
                  (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar60 >> 0xbf,0) == '\0') &&
                (auVar60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar60[0x1f]) {
              auVar60 = local_2960;
            }
            uVar41 = vmovmskps_avx(auVar60);
            uVar40 = 0;
            for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
              uVar40 = uVar40 + 1;
            }
            auVar58 = vpcmpeqd_avx(auVar20._0_16_,auVar20._0_16_);
            auVar94 = ZEXT1664(auVar58);
            do {
              uVar47 = CONCAT44(0,uVar40);
              uVar40 = *(uint *)((long)&local_23c0 + uVar47 * 4);
              pGVar10 = (pSVar4->geometries).items[uVar40].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2960 + uVar47 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar119 = *(undefined4 *)(local_2720 + uVar47 * 4);
                  uVar2 = *(undefined4 *)(local_2700 + uVar47 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_26c0[uVar47 - 8];
                  *(float *)(ray + k * 4 + 0xc0) = local_26c0[uVar47];
                  *(float *)(ray + k * 4 + 0xd0) = local_26a0[uVar47];
                  *(float *)(ray + k * 4 + 0xe0) = local_2680[uVar47];
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar119;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_28c0 + uVar47 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar40;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                uVar119 = *(undefined4 *)(local_2720 + uVar47 * 4);
                local_2860._4_4_ = uVar119;
                local_2860._0_4_ = uVar119;
                local_2860._8_4_ = uVar119;
                local_2860._12_4_ = uVar119;
                local_2850 = *(undefined4 *)(local_2700 + uVar47 * 4);
                local_2830._4_4_ = uVar40;
                local_2830._0_4_ = uVar40;
                local_2830._8_4_ = uVar40;
                local_2830._12_4_ = uVar40;
                uVar119 = *(undefined4 *)((long)&local_28c0 + uVar47 * 4);
                local_2840._4_4_ = uVar119;
                local_2840._0_4_ = uVar119;
                local_2840._8_4_ = uVar119;
                local_2840._12_4_ = uVar119;
                fVar127 = local_26c0[uVar47];
                fVar134 = local_26a0[uVar47];
                local_2880._4_4_ = fVar134;
                local_2880._0_4_ = fVar134;
                local_2880._8_4_ = fVar134;
                local_2880._12_4_ = fVar134;
                fVar134 = local_2680[uVar47];
                local_2870._4_4_ = fVar134;
                local_2870._0_4_ = fVar134;
                local_2870._8_4_ = fVar134;
                local_2870._12_4_ = fVar134;
                local_2890[0] = (RTCHitN)SUB41(fVar127,0);
                local_2890[1] = (RTCHitN)(char)((uint)fVar127 >> 8);
                local_2890[2] = (RTCHitN)(char)((uint)fVar127 >> 0x10);
                local_2890[3] = (RTCHitN)(char)((uint)fVar127 >> 0x18);
                local_2890[4] = (RTCHitN)SUB41(fVar127,0);
                local_2890[5] = (RTCHitN)(char)((uint)fVar127 >> 8);
                local_2890[6] = (RTCHitN)(char)((uint)fVar127 >> 0x10);
                local_2890[7] = (RTCHitN)(char)((uint)fVar127 >> 0x18);
                local_2890[8] = (RTCHitN)SUB41(fVar127,0);
                local_2890[9] = (RTCHitN)(char)((uint)fVar127 >> 8);
                local_2890[10] = (RTCHitN)(char)((uint)fVar127 >> 0x10);
                local_2890[0xb] = (RTCHitN)(char)((uint)fVar127 >> 0x18);
                local_2890[0xc] = (RTCHitN)SUB41(fVar127,0);
                local_2890[0xd] = (RTCHitN)(char)((uint)fVar127 >> 8);
                local_2890[0xe] = (RTCHitN)(char)((uint)fVar127 >> 0x10);
                local_2890[0xf] = (RTCHitN)(char)((uint)fVar127 >> 0x18);
                uStack_284c = local_2850;
                uStack_2848 = local_2850;
                uStack_2844 = local_2850;
                vpcmpeqd_avx2(ZEXT1632(local_2860),ZEXT1632(local_2860));
                uStack_281c = context->user->instID[0];
                local_2820 = uStack_281c;
                uStack_2818 = uStack_281c;
                uStack_2814 = uStack_281c;
                uStack_2810 = context->user->instPrimID[0];
                uStack_280c = uStack_2810;
                uStack_2808 = uStack_2810;
                uStack_2804 = uStack_2810;
                *(float *)(ray + k * 4 + 0x80) = local_26c0[uVar47 - 8];
                local_29c0 = *local_29b0;
                local_2990.valid = (int *)local_29c0;
                local_2990.geometryUserPtr = pGVar10->userPtr;
                local_2990.context = context->user;
                local_2990.hit = local_2890;
                local_2990.N = 4;
                local_2900 = auVar57._0_32_;
                local_2920 = auVar93._0_32_;
                local_2940._0_8_ = uVar47;
                local_2990.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar58 = auVar94._0_16_;
                  (*pGVar10->intersectionFilterN)(&local_2990);
                  auVar93 = ZEXT3264(local_2920);
                  auVar57 = ZEXT3264(local_2900);
                  auVar58 = vpcmpeqd_avx(auVar58,auVar58);
                  auVar94 = ZEXT1664(auVar58);
                  uVar47 = local_2940._0_8_;
                }
                auVar58 = auVar94._0_16_;
                if (local_29c0 == (undefined1  [16])0x0) {
                  auVar67 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar67 = auVar67 ^ auVar58;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var11)(&local_2990);
                    auVar93 = ZEXT3264(local_2920);
                    auVar57 = ZEXT3264(local_2900);
                    auVar58 = vpcmpeqd_avx(auVar58,auVar58);
                    auVar94 = ZEXT1664(auVar58);
                    uVar47 = local_2940._0_8_;
                  }
                  auVar58 = vpcmpeqd_avx(local_29c0,_DAT_01f45a50);
                  auVar67 = auVar58 ^ auVar94._0_16_;
                  if (local_29c0 != (undefined1  [16])0x0) {
                    auVar58 = auVar58 ^ auVar94._0_16_;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])local_2990.hit);
                    *(undefined1 (*) [16])(local_2990.ray + 0xc0) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x10));
                    *(undefined1 (*) [16])(local_2990.ray + 0xd0) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x20));
                    *(undefined1 (*) [16])(local_2990.ray + 0xe0) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x30));
                    *(undefined1 (*) [16])(local_2990.ray + 0xf0) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x40));
                    *(undefined1 (*) [16])(local_2990.ray + 0x100) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x50));
                    *(undefined1 (*) [16])(local_2990.ray + 0x110) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x60));
                    *(undefined1 (*) [16])(local_2990.ray + 0x120) = auVar71;
                    auVar71 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x70));
                    *(undefined1 (*) [16])(local_2990.ray + 0x130) = auVar71;
                    auVar58 = vmaskmovps_avx(auVar58,*(undefined1 (*) [16])(local_2990.hit + 0x80));
                    *(undefined1 (*) [16])(local_2990.ray + 0x140) = auVar58;
                  }
                }
                auVar53._8_8_ = 0x100000001;
                auVar53._0_8_ = 0x100000001;
                if ((auVar53 & auVar67) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar93._0_4_;
                }
                else {
                  auVar93 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2960 + uVar47 * 4) = 0;
                uVar119 = auVar93._0_4_;
                auVar56._4_4_ = uVar119;
                auVar56._0_4_ = uVar119;
                auVar56._8_4_ = uVar119;
                auVar56._12_4_ = uVar119;
                auVar56._16_4_ = uVar119;
                auVar56._20_4_ = uVar119;
                auVar56._24_4_ = uVar119;
                auVar56._28_4_ = uVar119;
                auVar60 = vcmpps_avx(auVar57._0_32_,auVar56,2);
                local_2960 = vandps_avx(auVar60,local_2960);
              }
              if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2960 >> 0x7f,0) == '\0') &&
                    (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2960 >> 0xbf,0) == '\0') &&
                  (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2960[0x1f]) break;
              auVar66._8_4_ = 0x7f800000;
              auVar66._0_8_ = 0x7f8000007f800000;
              auVar66._12_4_ = 0x7f800000;
              auVar66._16_4_ = 0x7f800000;
              auVar66._20_4_ = 0x7f800000;
              auVar66._24_4_ = 0x7f800000;
              auVar66._28_4_ = 0x7f800000;
              auVar60 = vblendvps_avx(auVar66,auVar57._0_32_,local_2960);
              auVar72 = vshufps_avx(auVar60,auVar60,0xb1);
              auVar72 = vminps_avx(auVar60,auVar72);
              auVar65 = vshufpd_avx(auVar72,auVar72,5);
              auVar72 = vminps_avx(auVar72,auVar65);
              auVar65 = vpermpd_avx2(auVar72,0x4e);
              auVar72 = vminps_avx(auVar72,auVar65);
              auVar72 = vcmpps_avx(auVar60,auVar72,0);
              auVar65 = local_2960 & auVar72;
              auVar60 = local_2960;
              if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar65 >> 0x7f,0) != '\0') ||
                    (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar65 >> 0xbf,0) != '\0') ||
                  (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar65[0x1f] < '\0') {
                auVar60 = vandps_avx(auVar72,local_2960);
              }
              uVar41 = vmovmskps_avx(auVar60);
              uVar40 = 0;
              for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
                uVar40 = uVar40 + 1;
              }
            } while( true );
          }
        }
      }
      auVar94 = ZEXT3264(local_2500);
      auVar97 = ZEXT3264(local_2520);
      auVar106 = ZEXT3264(local_2540);
      auVar93 = ZEXT3264(local_28e0);
      fVar107 = local_2560;
      fVar110 = fStack_255c;
      fVar82 = fStack_2558;
      fVar95 = fStack_2554;
      fVar87 = fStack_2550;
      fVar88 = fStack_254c;
      fVar89 = fStack_2548;
      fVar111 = local_2580;
      fVar90 = fStack_257c;
      fVar91 = fStack_2578;
      fVar114 = fStack_2574;
      fVar115 = fStack_2570;
      fVar116 = fStack_256c;
      fVar117 = fStack_2568;
      fVar118 = local_25a0;
      fVar121 = fStack_259c;
      fVar122 = fStack_2598;
      fVar123 = fStack_2594;
      fVar124 = fStack_2590;
      fVar125 = fStack_258c;
      fVar126 = fStack_2588;
      fVar127 = local_25c0;
      fVar129 = fStack_25bc;
      fVar130 = fStack_25b8;
      fVar131 = fStack_25b4;
      fVar132 = fStack_25b0;
      fVar133 = fStack_25ac;
      fVar98 = fStack_25a8;
      fVar134 = local_25e0;
      fVar99 = fStack_25dc;
      fVar100 = fStack_25d8;
      fVar101 = fStack_25d4;
      fVar102 = fStack_25d0;
      fVar103 = fStack_25cc;
      fVar136 = fStack_25c8;
      fVar137 = local_2600;
      fVar139 = fStack_25fc;
      fVar140 = fStack_25f8;
      fVar141 = fStack_25f4;
      fVar142 = fStack_25f0;
      fVar143 = fStack_25ec;
      fVar144 = fStack_25e8;
    }
    uVar119 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar57 = ZEXT3264(CONCAT428(uVar119,CONCAT424(uVar119,CONCAT420(uVar119,CONCAT416(uVar119,
                                                  CONCAT412(uVar119,CONCAT48(uVar119,CONCAT44(
                                                  uVar119,uVar119))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }